

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O2

void __thiscall txrequest_tests::TxRequestTest::test_method(TxRequestTest *this)

{
  FastRandomContext *__urng;
  __normal_iterator<std::function<void_((anonymous_namespace)::Scenario_&)>_*,_std::vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>_>
  __a;
  long lVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer ppVar5;
  int iVar6;
  _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  *p_Var7;
  _Any_data *p_Var8;
  pointer pfVar9;
  _Any_data *p_Var10;
  result_type_conflict rVar11;
  uint64_t uVar12;
  microseconds mVar13;
  microseconds mVar14;
  microseconds mVar15;
  undefined8 uVar16;
  code *in_RCX;
  char *in_RDX;
  size_t __n;
  char *extraout_RDX;
  size_t __n_00;
  char *extraout_RDX_00;
  size_t __n_01;
  char *extraout_RDX_01;
  size_t __n_02;
  char *extraout_RDX_02;
  size_t __n_03;
  char *extraout_RDX_03;
  size_t __n_04;
  char *extraout_RDX_04;
  size_t __n_05;
  char *extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  char *extraout_RDX_08;
  long lVar17;
  pointer ppVar18;
  int iVar19;
  uint uVar20;
  Scenario *in_RSI;
  iterator in_R8;
  iterator pvVar21;
  iterator in_R9;
  assertion_result *paVar22;
  __normal_iterator<std::function<void_((anonymous_namespace)::Scenario_&)>_*,_std::vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>_>
  __a_00;
  pointer ppVar23;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  pair<unsigned_long,_unsigned_long> pVar24;
  check_type cVar25;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  assertion_result local_1a0;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  local_138;
  Scenario scenario;
  Runner runner;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __urng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  iVar6 = 0;
  do {
    if (iVar6 == 5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0055ed08:
      __stack_chk_fail();
    }
    local_138.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (iVar19 = 0;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pfVar2 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, iVar19 != 0x40; iVar19 = iVar19 + 1) {
      if (local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar2 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar3 - (long)pfVar2;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(int *)((long)p_Var8 + lVar17 + 8) = iVar19;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        in_RCX = _GLOBAL__N_1::std::
                 _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
                 ::_M_manager;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar2,pfVar3,(pointer)p_Var8,
                               (_Tp_alloc_type *)
                               _GLOBAL__N_1::std::
                               _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
                               ::_M_manager);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate(pfVar3,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar2 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar2,(pointer)in_RSI,__n);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 8) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 9) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 10) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 0xb) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 0xc) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 0xd) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 0xe) = '\0';
        *(char *)((long)&((local_138.
                           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super__Function_base).
                         _M_functor + 0xf) = '\0';
        *(TxRequestTest **)
         local_138.
         super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = this;
        *(int *)((long)local_138.
                       super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 8) = iVar19;
        *(code **)((long)local_138.
                         super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        *(code **)((long)local_138.
                         super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        p_Var10 = (_Any_data *)
                  ((long)local_138.
                         super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x20);
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(int *)((long)p_Var8 + lVar17 + 8) = iVar19;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_00);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_00;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(int *)(p_Var10->_M_pod_data + 8) = iVar19;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(int *)((long)p_Var8 + lVar17 + 8) = iVar19;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_01);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_01;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(int *)(p_Var10->_M_pod_data + 8) = iVar19;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(int *)((long)p_Var8 + lVar17 + 8) = iVar19;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_02);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_02;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(int *)(p_Var10->_M_pod_data + 8) = iVar19;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(int *)((long)p_Var8 + lVar17 + 8) = iVar19;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_03);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_03;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(int *)(p_Var10->_M_pod_data + 8) = iVar19;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(undefined8 *)((long)p_Var8 + lVar17 + 8) = 0;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_04);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_04;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (p_Var10 ==
          (_Any_data *)
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
        p_Var7 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  *)_GLOBAL__N_1::std::
                    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ::_M_check_len(&local_138,(size_type)in_RSI,in_RDX);
        pfVar4 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pfVar3 = local_138.
                 super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Any_data *)
                 _GLOBAL__N_1::std::
                 _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_M_allocate(p_Var7,(size_t)in_RSI);
        lVar17 = (long)pfVar2 - (long)pfVar3;
        *(undefined8 *)((long)p_Var8 + lVar17 + 8) = 0;
        *(TxRequestTest **)((long)p_Var8 + lVar17) = this;
        *(code **)((long)p_Var8 + lVar17 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        *(code **)((long)p_Var8 + lVar17 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        pfVar9 = _GLOBAL__N_1::std::
                 vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                 ::_S_relocate(pfVar3,(pointer)p_Var10,(pointer)p_Var8,(_Tp_alloc_type *)in_RCX);
        p_Var10 = (_Any_data *)
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)p_Var10,pfVar4,pfVar9 + 1,(_Tp_alloc_type *)in_RCX);
        in_RSI = (Scenario *)
                 ((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar3 >> 5);
        _GLOBAL__N_1::std::
        _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ::_M_deallocate((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                         *)pfVar3,(pointer)in_RSI,__n_05);
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(p_Var8 + (long)p_Var7 * 2);
        in_RDX = extraout_RDX_05;
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var8;
      }
      else {
        *(char *)((long)p_Var10 + 8) = '\0';
        *(char *)((long)p_Var10 + 9) = '\0';
        *(char *)((long)p_Var10 + 10) = '\0';
        *(char *)((long)p_Var10 + 0xb) = '\0';
        *(char *)((long)p_Var10 + 0xc) = '\0';
        *(char *)((long)p_Var10 + 0xd) = '\0';
        *(char *)((long)p_Var10 + 0xe) = '\0';
        *(char *)((long)p_Var10 + 0xf) = '\0';
        *(TxRequestTest **)p_Var10 = this;
        *(code **)((long)p_Var10 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        *(code **)(p_Var10 + 1) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        p_Var10 = p_Var10 + 2;
      }
      local_138.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
    }
    if (local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((ulong)((long)local_138.
                        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_138.
                       super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x1fffffffe1) {
        __a._M_current =
             (function<void_((anonymous_namespace)::Scenario_&)> *)
             ((long)local_138.
                    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x20);
        __a_00._M_current = __a._M_current;
        if (((long)local_138.
                   super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_138.
                   super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
          runner.txrequest.m_impl._M_t.
          super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
          .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
               (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
               (__uniq_ptr_data<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>,_true,_true>
                )0x0;
          runner.actions.
          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
          rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&runner,__urng);
          __a_00._M_current =
               (function<void_((anonymous_namespace)::Scenario_&)> *)((long)pfVar2 + 0x40);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>,__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>>
                    (__a,(function<void_((anonymous_namespace)::Scenario_&)> *)
                         ((long)pfVar2 + rVar11 * 2 * 0x10));
        }
        lVar17 = (long)__a_00._M_current - (long)pfVar2;
        for (; __a_00._M_current != pfVar3; __a_00._M_current = __a_00._M_current + 2) {
          pVar24 = std::__gen_two_uniform_ints<unsigned_long,FastRandomContext&>
                             ((lVar17 >> 5) + 1,(lVar17 >> 5) + 2,__urng);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>,__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>>
                    (__a_00,(function<void_((anonymous_namespace)::Scenario_&)> *)
                            ((long)pfVar2 + pVar24.first * 2 * 0x10));
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>,__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>>
                    (__a_00._M_current + 1,
                     (function<void_((anonymous_namespace)::Scenario_&)> *)
                     ((long)pfVar2 + pVar24.second * 2 * 0x10));
          lVar17 = lVar17 + 0x40;
        }
      }
      else {
        runner.txrequest.m_impl._M_t.
        super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>.
        _M_t.
        super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
        .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
             (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
             (__uniq_ptr_data<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>,_true,_true>
              )0x0;
        runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
        for (lVar17 = 0x20;
            (function<void_((anonymous_namespace)::Scenario_&)> *)((long)pfVar2 + lVar17) != pfVar3;
            lVar17 = lVar17 + 0x20) {
          scenario.m_runner = (Runner *)(lVar17 >> 5);
          scenario.m_rng = (FastRandomContext *)0x0;
          rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&runner,__urng,
                              (param_type *)&scenario);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>,__gnu_cxx::__normal_iterator<std::function<void((anonymous_namespace)::Scenario&)>*,std::vector<std::function<void((anonymous_namespace)::Scenario&)>,std::allocator<std::function<void((anonymous_namespace)::Scenario&)>>>>>
                    ((function<void_((anonymous_namespace)::Scenario_&)> *)((long)pfVar2 + lVar17),
                     (function<void_((anonymous_namespace)::Scenario_&)> *)
                     ((long)pfVar2 + rVar11 * 2 * 0x10));
        }
      }
    }
    TxRequestTracker::TxRequestTracker(&runner.txrequest,false);
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.expired._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar12 = RandomMixin<FastRandomContext>::randbits
                       (&__urng->super_RandomMixin<FastRandomContext>,0x2d);
    while (ppVar5 = runner.actions.
                    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          ppVar18 = runner.actions.
                    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
      mVar13 = anon_unknown.dwarf_12d03c0::TxRequestTest::RandomTime8s
                         (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
      mVar14 = anon_unknown.dwarf_12d03c0::TxRequestTest::RandomTime8s
                         (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
      mVar15 = anon_unknown.dwarf_12d03c0::TxRequestTest::RandomTime8s
                         (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
      pfVar2 = local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      scenario.m_now.__r = mVar15.__r + mVar14.__r + mVar13.__r + uVar12 + 1;
      scenario.m_testname._M_dataplus._M_p = (pointer)&scenario.m_testname.field_2;
      scenario.m_testname._M_string_length = 0;
      scenario.m_testname.field_2._M_local_buf[0] = '\0';
      uVar16 = extraout_RDX_06;
      p_Var8 = (_Any_data *)
               local_138.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      scenario.m_rng = __urng;
      scenario.m_runner = &runner;
      for (uVar20 = 0; (p_Var8 != (_Any_data *)pfVar2 && (uVar20 < 10)); uVar20 = uVar20 + 1) {
        if (*(long *)(p_Var8 + -1) == 0) {
          local_138.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            uVar16 = std::__throw_bad_function_call();
            _GLOBAL__N_1::std::
            vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ::~vector(&local_138);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              _Unwind_Resume(uVar16);
            }
          }
          goto LAB_0055ed08;
        }
        p_Var10 = p_Var8 + -2;
        (**(code **)((long)p_Var8 + -8))(p_Var10,(_Any_data *)&scenario,(_Manager_operation)uVar16);
        std::_Function_base::~_Function_base((_Function_base *)p_Var10);
        uVar16 = extraout_RDX_07;
        p_Var8 = p_Var10;
      }
      local_138.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
      std::__cxx11::string::~string((string *)&scenario.m_testname);
    }
    ppVar23 = runner.actions.
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)&scenario,
                          (__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>
                           )runner.actions.
                            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (((long)runner.actions.
                                  super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)runner.actions.
                                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28 + 1) / 2);
      if (scenario.m_now.__r == 0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (ppVar18,ppVar5);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (ppVar18,ppVar5,scenario.m_now.__r,scenario.m_runner);
      }
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                  *)&scenario);
      ppVar18 = runner.actions.
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar23 = runner.actions.
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; ppVar23 != ppVar18; ppVar23 = ppVar23 + 1) {
      _GLOBAL__N_1::std::function<void_()>::operator()(&ppVar23->second);
    }
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_140 = "";
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x2e5;
    file.m_begin = (iterator)&local_148;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
    scenario.m_runner = (Runner *)((ulong)scenario.m_runner & 0xffffffffffffff00);
    scenario.m_rng = (FastRandomContext *)&PTR__lazy_ostream_01139f30;
    scenario.m_now.__r = (rep)boost::unit_test::lazy_ostream::inst;
    scenario.m_testname._M_dataplus._M_p = "";
    local_168 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_160 = "";
    local_1a0._0_8_ = TxRequestTracker::Size(&runner.txrequest);
    local_178 = (char *)((ulong)local_178 & 0xffffffff00000000);
    pvVar21 = (iterator)0x2;
    paVar22 = &local_1a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&scenario,&local_168,0x2e5,1,2,paVar22,"runner.txrequest.Size()",&local_178,"0U");
    local_178 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_170 = "";
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar25 = 0x55eb10;
    msg_00.m_end = (iterator)paVar22;
    msg_00.m_begin = pvVar21;
    file_00.m_end = (iterator)0x2e6;
    file_00.m_begin = (iterator)&local_178;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
               msg_00);
    local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_1a0.m_message.px = (element_type *)0x0;
    local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1b0 = "runner.expired.empty()";
    local_1a8 = "";
    scenario.m_runner = (Runner *)((ulong)scenario.m_runner & 0xffffffffffffff00);
    scenario.m_rng = (FastRandomContext *)&PTR__lazy_ostream_0113a070;
    scenario.m_now.__r = (rep)boost::unit_test::lazy_ostream::inst;
    scenario.m_testname._M_dataplus._M_p = (pointer)&local_1b0;
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_1b8 = "";
    in_RSI = &scenario;
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    in_RCX = (code *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1a0,(lazy_ostream *)in_RSI,1,0,WARN,_cVar25,(size_t)&local_1c0,0x2e6);
    boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
    anon_unknown.dwarf_12d03c0::Runner::~Runner(&runner);
    _GLOBAL__N_1::std::
    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ::~vector(&local_138);
    iVar6 = iVar6 + 1;
    in_RDX = extraout_RDX_08;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(TxRequestTest)
{
    for (int i = 0; i < 5; ++i) {
        TestInterleavedScenarios();
    }
}